

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O1

string * __thiscall
cmFindPathCommand::FindHeaderInFramework
          (string *__return_storage_ptr__,cmFindPathCommand *this,string *file,string *dir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  GlobInternals *pGVar2;
  GlobInternals *pGVar3;
  char cVar4;
  pointer pcVar5;
  undefined1 *puVar6;
  bool bVar7;
  long lVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  GlobInternals *pGVar9;
  string glob;
  string frameWorkName;
  string fileName;
  Glob globIt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  undefined1 local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  long local_b8 [2];
  cmFindPathCommand *local_a8;
  undefined1 local_a0 [24];
  size_type sStack_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_c8._M_allocated_capacity = (size_type)local_b8;
  pcVar5 = (file->_M_dataplus)._M_p;
  local_a8 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_d8 + 0x10),pcVar5,pcVar5 + file->_M_string_length);
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
  local_e0 = 0;
  local_d8[0] = 0;
  lVar8 = std::__cxx11::string::find((char)(string *)(local_d8 + 0x10),0x2f);
  if (lVar8 != -1) {
    std::__cxx11::string::substr((ulong)local_a0,(ulong)(local_d8 + 0x10));
    std::__cxx11::string::operator=((string *)(local_d8 + 0x10),(string *)local_a0);
    pGVar2 = (GlobInternals *)(local_a0 + 0x10);
    if ((GlobInternals *)local_a0._0_8_ != pGVar2) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
    }
    std::__cxx11::string::_M_assign((string *)&local_e8);
    std::__cxx11::string::substr((ulong)local_a0,(ulong)&local_e8);
    std::__cxx11::string::operator=((string *)&local_e8,(string *)local_a0);
    if ((GlobInternals *)local_a0._0_8_ != pGVar2) {
      operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
    }
    lVar8 = std::__cxx11::string::find((char)&local_e8,0x2f);
    if (lVar8 != -1) {
      std::__cxx11::string::_M_assign((string *)(local_d8 + 0x10));
      local_e0 = 0;
      *(undefined1 *)&(local_e8->_M_dataplus)._M_p = 0;
    }
    if (local_e0 != 0) {
      pcVar5 = (dir->_M_dataplus)._M_p;
      local_a0._0_8_ = pGVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a0,pcVar5,pcVar5 + dir->_M_string_length);
      std::__cxx11::string::_M_append(local_a0,(ulong)local_e8);
      std::__cxx11::string::append(local_a0);
      pGVar3 = (GlobInternals *)(local_108 + 0x10);
      local_108._0_8_ = pGVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_108,local_a0._0_8_,
                 (pointer)((long)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_a0._0_8_)->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + local_a0._8_8_));
      std::__cxx11::string::append(local_108);
      std::__cxx11::string::_M_append(local_108,local_c8._M_allocated_capacity);
      bVar7 = cmsys::SystemTools::FileExists((string *)local_108);
      if (bVar7) {
        cVar4 = (local_a8->super_cmFindBase).field_0x222;
        paVar1 = &__return_storage_ptr__->field_2;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
        if (cVar4 == '\x01') {
          if ((GlobInternals *)local_108._0_8_ == pGVar3) {
            paVar1->_M_allocated_capacity = local_108._16_8_;
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_108._24_8_;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_108._0_8_;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = local_108._16_8_;
          }
          puVar6 = local_108;
          __return_storage_ptr__->_M_string_length = local_108._8_8_;
          pGVar9 = pGVar3;
          local_108._0_8_ = pGVar3;
        }
        else {
          if ((GlobInternals *)local_a0._0_8_ == pGVar2) {
            paVar1->_M_allocated_capacity = local_a0._16_8_;
            *(size_type *)((long)&__return_storage_ptr__->field_2 + 8) = sStack_88;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_a0._0_8_;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = local_a0._16_8_;
          }
          puVar6 = local_a0;
          __return_storage_ptr__->_M_string_length = local_a0._8_8_;
          pGVar9 = pGVar2;
          local_a0._0_8_ = pGVar2;
        }
        *(undefined8 *)(puVar6 + 8) = 0;
        *(char *)&(pGVar9->Files).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = '\0';
        if ((GlobInternals *)local_108._0_8_ != pGVar3) {
          operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
        }
        if ((GlobInternals *)local_a0._0_8_ != pGVar2) {
          operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
        }
        if (bVar7) goto LAB_001eec0a;
      }
      else {
        if ((GlobInternals *)local_108._0_8_ != pGVar3) {
          operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
        }
        if ((GlobInternals *)local_a0._0_8_ != pGVar2) {
          operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
        }
      }
    }
  }
  pcVar5 = (dir->_M_dataplus)._M_p;
  local_108._0_8_ = local_108 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_108,pcVar5,pcVar5 + dir->_M_string_length);
  std::__cxx11::string::append(local_108);
  std::__cxx11::string::_M_append(local_108,(ulong)(file->_M_dataplus)._M_p);
  cmsys::Glob::Glob((Glob *)local_a0);
  cmsys::Glob::FindFiles((Glob *)local_a0,(string *)local_108,(GlobMessages *)0x0);
  __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__x);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    cmsys::SystemTools::CollapseFullPath
              (__return_storage_ptr__,
               local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    if ((local_a8->super_cmFindBase).field_0x222 == '\0') {
      std::__cxx11::string::resize
                ((ulong)__return_storage_ptr__,
                 (char)__return_storage_ptr__->_M_string_length - (char)file->_M_string_length);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  cmsys::Glob::~Glob((Glob *)local_a0);
  if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
  }
LAB_001eec0a:
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8) {
    operator_delete(local_e8,CONCAT71(local_d8._1_7_,local_d8[0]) + 1);
  }
  if ((long *)local_c8._M_allocated_capacity != local_b8) {
    operator_delete((void *)local_c8._M_allocated_capacity,local_b8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindPathCommand::FindHeaderInFramework(std::string const& file,
                                                     std::string const& dir)
{
  std::string fileName = file;
  std::string frameWorkName;
  std::string::size_type pos = fileName.find('/');
  // if there is a / in the name try to find the header as a framework
  // For example bar/foo.h would look for:
  // bar.framework/Headers/foo.h
  if (pos != std::string::npos) {
    // remove the name from the slash;
    fileName = fileName.substr(pos + 1);
    frameWorkName = file;
    frameWorkName =
      frameWorkName.substr(0, frameWorkName.size() - fileName.size() - 1);
    // if the framework has a path in it then just use the filename
    if (frameWorkName.find('/') != std::string::npos) {
      fileName = file;
      frameWorkName.clear();
    }
    if (!frameWorkName.empty()) {
      std::string fpath = dir;
      fpath += frameWorkName;
      fpath += ".framework";
      std::string intPath = fpath;
      intPath += "/Headers/";
      intPath += fileName;
      if (cmSystemTools::FileExists(intPath)) {
        if (this->IncludeFileInPath) {
          return intPath;
        }
        return fpath;
      }
    }
  }
  // if it is not found yet or not a framework header, then do a glob search
  // for all frameworks in the directory: dir/*.framework/Headers/<file>
  std::string glob = dir;
  glob += "*.framework/Headers/";
  glob += file;
  cmsys::Glob globIt;
  globIt.FindFiles(glob);
  std::vector<std::string> files = globIt.GetFiles();
  if (!files.empty()) {
    std::string fheader = cmSystemTools::CollapseFullPath(files[0]);
    if (this->IncludeFileInPath) {
      return fheader;
    }
    fheader.resize(fheader.size() - file.size());
    return fheader;
  }
  return "";
}